

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_owner.c
# Opt level: O0

void test_gid(void)

{
  wchar_t wVar1;
  archive *_a;
  archive_entry *entry;
  archive *m;
  archive_entry *ae;
  
  _a = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                           ,L'L',(uint)(_a != (archive *)0x0),"(m = archive_match_new()) != NULL",
                           (void *)0x0);
  if (wVar1 != L'\0') {
    entry = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                             ,L'N',(uint)(entry != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 == L'\0') {
      archive_match_free(_a);
    }
    else {
      wVar1 = archive_match_include_gid(_a,1000);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'S',0,"0",(long)wVar1,"archive_match_include_gid(m, 1000)",_a);
      wVar1 = archive_match_include_gid(_a,0x3ea);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'T',0,"0",(long)wVar1,"archive_match_include_gid(m, 1002)",_a);
      archive_entry_set_gid(entry,0);
      failure("uid 0 should be excluded");
      wVar1 = archive_match_owner_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'X',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Y',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(entry,1000);
      failure("uid 1000 should not be excluded");
      wVar1 = archive_match_owner_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\\',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L']',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(entry,0x3e9);
      failure("uid 1001 should be excluded");
      wVar1 = archive_match_owner_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'`',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'a',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(entry,0x3ea);
      failure("uid 1002 should not be excluded");
      wVar1 = archive_match_owner_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'd',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'e',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(entry,0x3eb);
      failure("uid 1003 should be excluded");
      wVar1 = archive_match_owner_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'h',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(_a,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'i',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(entry);
      archive_match_free(_a);
    }
  }
  return;
}

Assistant:

static void
test_gid(void)
{
	struct archive_entry *ae;
	struct archive *m;

	if (!assert((m = archive_match_new()) != NULL))
		return;
	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}

	assertEqualIntA(m, 0, archive_match_include_gid(m, 1000));
	assertEqualIntA(m, 0, archive_match_include_gid(m, 1002));

	archive_entry_set_gid(ae, 0);
	failure("uid 0 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_gid(ae, 1000);
	failure("uid 1000 should not be excluded");
	assertEqualInt(0, archive_match_owner_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_gid(ae, 1001);
	failure("uid 1001 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_gid(ae, 1002);
	failure("uid 1002 should not be excluded");
	assertEqualInt(0, archive_match_owner_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_gid(ae, 1003);
	failure("uid 1003 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Clean up. */
	archive_entry_free(ae);
	archive_match_free(m);
}